

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::addDockWidget
          (QDockAreaLayout *this,DockPosition pos,QDockWidget *dockWidget,Orientation orientation)

{
  bool bVar1;
  QDockAreaLayout *_widgetItem;
  qsizetype qVar2;
  QDockAreaLayoutInfo *this_00;
  int in_ECX;
  uint in_ESI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  int tbshape;
  QDockAreaLayoutInfo *info;
  QLayoutItem *dockWidgetItem;
  QDockAreaLayoutInfo new_info;
  QDockAreaLayoutItem new_item;
  QDockAreaLayoutInfo *in_stack_fffffffffffffe88;
  QMainWindow *in_stack_fffffffffffffe90;
  QDockAreaLayoutItem *in_stack_fffffffffffffe98;
  QDockAreaLayoutItem *in_stack_fffffffffffffea0;
  QDockAreaLayoutItem *this_01;
  QList<QDockAreaLayoutItem> *in_stack_fffffffffffffea8;
  QList<QDockAreaLayoutItem> *pQVar3;
  QDockAreaLayout *this_02;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff20;
  QDockAreaLayoutItem local_c8;
  undefined1 local_a0 [64];
  QDockAreaLayoutItem QStack_60;
  QDockAreaLayoutItem local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _widgetItem = (QDockAreaLayout *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem
            ((QDockWidgetItem *)in_stack_fffffffffffffe90,(QDockWidget *)in_stack_fffffffffffffe88);
  pQVar3 = &in_RDI[in_ESI].item_list;
  this_02 = _widgetItem;
  if (in_ECX != *(int *)((long)(pQVar3 + 1) + 0xc)) {
    qVar2 = QList<QDockAreaLayoutItem>::size
                      ((QList<QDockAreaLayoutItem> *)((long)(pQVar3 + 2) + 0x10));
    if (1 < qVar2) {
      memset(local_a0,0xaa,0x70);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo
                ((QDockAreaLayoutInfo *)this_02,(int *)in_stack_fffffffffffffea8,
                 (DockPosition)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                 (Orientation)in_stack_fffffffffffffea0,
                 (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90);
      this_00 = (QDockAreaLayoutInfo *)operator_new(0x70);
      QDockAreaLayoutInfo::QDockAreaLayoutInfo(this_00,in_stack_fffffffffffffe88);
      QDockAreaLayoutItem::QDockAreaLayoutItem(&local_c8,this_00);
      QList<QDockAreaLayoutItem>::append
                ((QList<QDockAreaLayoutItem> *)this_00,(rvalue_ref)in_stack_fffffffffffffe88);
      QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffea0);
      this_01 = &QStack_60;
      QDockAreaLayoutItem::QDockAreaLayoutItem
                ((QDockAreaLayoutItem *)&stack0xffffffffffffff10,(QLayoutItem *)_widgetItem);
      QList<QDockAreaLayoutItem>::append
                ((QList<QDockAreaLayoutItem> *)this_00,(rvalue_ref)in_stack_fffffffffffffe88);
      QDockAreaLayoutItem::~QDockAreaLayoutItem(this_01);
      QDockAreaLayoutInfo::operator=(this_00,in_stack_fffffffffffffe88);
      QDockAreaLayoutInfo::~QDockAreaLayoutInfo(this_00);
      goto LAB_0057b5e2;
    }
  }
  *(int *)((long)(pQVar3 + 1) + 0xc) = in_ECX;
  memset(&local_30,0xaa,0x28);
  QDockAreaLayoutItem::QDockAreaLayoutItem(&local_30,(QLayoutItem *)_widgetItem);
  QList<QDockAreaLayoutItem>::append
            ((QList<QDockAreaLayoutItem> *)in_stack_fffffffffffffe90,
             (parameter_type)in_stack_fffffffffffffe88);
  if ((*(byte *)((long)(pQVar3 + 3) + 0x10) & 1) != 0) {
    bVar1 = QDockAreaLayoutItem::skip(in_stack_fffffffffffffe98);
    if (!bVar1) {
      QDockAreaLayoutInfo::updateTabBar(in_stack_ffffffffffffff20);
      tabId((QDockAreaLayoutItem *)in_stack_fffffffffffffe88);
      QDockAreaLayoutInfo::setCurrentTabId(in_RDI,(quintptr)this_02);
      in_stack_fffffffffffffea8 = pQVar3;
    }
  }
  QDockAreaLayoutItem::~QDockAreaLayoutItem(in_stack_fffffffffffffea0);
LAB_0057b5e2:
  QObject::objectName();
  removePlaceHolder(this_02,(QString *)in_stack_fffffffffffffea8);
  QString::~QString((QString *)0x57b60c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockAreaLayout::addDockWidget(QInternal::DockPosition pos, QDockWidget *dockWidget,
                                             Qt::Orientation orientation)
{
    QLayoutItem *dockWidgetItem = new QDockWidgetItem(dockWidget);
    QDockAreaLayoutInfo &info = docks[pos];
    if (orientation == info.o || info.item_list.size() <= 1) {
        // empty dock areas, or dock areas containing exactly one widget can have their orientation
        // switched.
        info.o = orientation;

        QDockAreaLayoutItem new_item(dockWidgetItem);
        info.item_list.append(new_item);
#if QT_CONFIG(tabbar)
        if (info.tabbed && !new_item.skip()) {
            info.updateTabBar();
            info.setCurrentTabId(tabId(new_item));
        }
#endif
    } else {
#if QT_CONFIG(tabbar)
        int tbshape = info.tabBarShape;
#else
        int tbshape = 0;
#endif
        QDockAreaLayoutInfo new_info(&sep, pos, orientation, tbshape, mainWindow);
        new_info.item_list.append(QDockAreaLayoutItem(new QDockAreaLayoutInfo(info)));
        new_info.item_list.append(QDockAreaLayoutItem(dockWidgetItem));
        info = new_info;
    }

    removePlaceHolder(dockWidget->objectName());
}